

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall calculator::FunctionNotDefined::~FunctionNotDefined(FunctionNotDefined *this)

{
  SyntaxError::~SyntaxError(&this->super_SyntaxError);
  operator_delete(this,0x28);
  return;
}

Assistant:

FunctionNotDefined(const std::string& function) {
        error_msg = "Error: function [" + function + "] not defined!";
    }